

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O1

void proxy_socks5_free(ProxyNegotiator *pn)

{
  strbuf_free((strbuf *)pn[-4].output[0].binarysink_[0].write);
  strbuf_free((strbuf *)pn[-1].output[0].binarysink_[0].binarysink_);
  strbuf_free((strbuf *)pn[-1].itr);
  if (*(prompts_t **)&pn[-1].done != (prompts_t *)0x0) {
    free_prompts(*(prompts_t **)&pn[-1].done);
  }
  smemclr(pn[-4].output,0x1a0);
  safefree(pn[-4].output);
  return;
}

Assistant:

static void proxy_socks5_free(ProxyNegotiator *pn)
{
    Socks5ProxyNegotiator *s = container_of(pn, Socks5ProxyNegotiator, pn);
    strbuf_free(s->auth_methods_offered);
    strbuf_free(s->username);
    strbuf_free(s->password);
    if (s->prompts)
        free_prompts(s->prompts);
    smemclr(s, sizeof(*s));
    sfree(s);
}